

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzDecompressInit(bz_stream *strm,int verbosity,int small)

{
  int iVar1;
  long *plVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  DState *s;
  int local_4;
  
  iVar1 = bz_config_ok();
  if (iVar1 == 0) {
    local_4 = -9;
  }
  else if (in_RDI == 0) {
    local_4 = -2;
  }
  else if ((in_EDX == 0) || (in_EDX == 1)) {
    if ((in_ESI < 0) || (4 < in_ESI)) {
      local_4 = -2;
    }
    else {
      if (*(long *)(in_RDI + 0x38) == 0) {
        *(code **)(in_RDI + 0x38) = default_bzalloc;
      }
      if (*(long *)(in_RDI + 0x40) == 0) {
        *(code **)(in_RDI + 0x40) = default_bzfree;
      }
      plVar2 = (long *)(**(code **)(in_RDI + 0x38))(*(undefined8 *)(in_RDI + 0x48),0xfa90,1);
      if (plVar2 == (long *)0x0) {
        local_4 = -3;
      }
      else {
        *plVar2 = in_RDI;
        *(long **)(in_RDI + 0x30) = plVar2;
        *(undefined4 *)(plVar2 + 1) = 10;
        *(undefined4 *)((long)plVar2 + 0x24) = 0;
        *(undefined4 *)(plVar2 + 4) = 0;
        *(undefined4 *)((long)plVar2 + 0xc74) = 0;
        *(undefined4 *)(in_RDI + 0xc) = 0;
        *(undefined4 *)(in_RDI + 0x10) = 0;
        *(undefined4 *)(in_RDI + 0x24) = 0;
        *(undefined4 *)(in_RDI + 0x28) = 0;
        *(char *)((long)plVar2 + 0x2c) = (char)in_EDX;
        plVar2[0x18c] = 0;
        plVar2[0x18b] = 0;
        plVar2[0x18a] = 0;
        *(undefined4 *)(plVar2 + 6) = 0;
        *(int *)((long)plVar2 + 0x34) = in_ESI;
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int BZ_API(BZ2_bzDecompressInit) 
                     ( bz_stream* strm, 
                       int        verbosity,
                       int        small )
{
   DState* s;

   if (!bz_config_ok()) return BZ_CONFIG_ERROR;

   if (strm == NULL) return BZ_PARAM_ERROR;
   if (small != 0 && small != 1) return BZ_PARAM_ERROR;
   if (verbosity < 0 || verbosity > 4) return BZ_PARAM_ERROR;

   if (strm->bzalloc == NULL) strm->bzalloc = default_bzalloc;
   if (strm->bzfree == NULL) strm->bzfree = default_bzfree;

   s = BZALLOC( sizeof(DState) );
   if (s == NULL) return BZ_MEM_ERROR;
   s->strm                  = strm;
   strm->state              = s;
   s->state                 = BZ_X_MAGIC_1;
   s->bsLive                = 0;
   s->bsBuff                = 0;
   s->calculatedCombinedCRC = 0;
   strm->total_in_lo32      = 0;
   strm->total_in_hi32      = 0;
   strm->total_out_lo32     = 0;
   strm->total_out_hi32     = 0;
   s->smallDecompress       = (Bool)small;
   s->ll4                   = NULL;
   s->ll16                  = NULL;
   s->tt                    = NULL;
   s->currBlockNo           = 0;
   s->verbosity             = verbosity;

   return BZ_OK;
}